

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O0

Value __thiscall Frame::popTopOfOperandStack(Frame *this)

{
  size_type sVar1;
  ostream *this_00;
  reference pvVar2;
  Value VVar3;
  Frame *this_local;
  Value top;
  undefined1 auVar4 [12];
  
  sVar1 = std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::size(&this->_operandStack);
  if (sVar1 == 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"IndexOutOfBoundsException");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  pvVar2 = std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::top(&this->_operandStack);
  std::stack<Value,_std::deque<Value,_std::allocator<Value>_>_>::pop(&this->_operandStack);
  VVar3.printType = pvVar2->printType;
  auVar4._4_4_ = pvVar2->type;
  VVar3.data = pvVar2->data;
  return VVar3;
}

Assistant:

Value Frame::popTopOfOperandStack() {
    if (_operandStack.size() == 0) {
        cerr << "IndexOutOfBoundsException" << endl;
        exit(1);
    }
    
    Value top = _operandStack.top();
    
    _operandStack.pop();
    return top;
}